

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_catalog_entry.cpp
# Opt level: O3

void __thiscall duckdb::ViewCatalogEntry::Initialize(ViewCatalogEntry *this,CreateViewInfo *info)

{
  LogicalDependencyList *__ht;
  LogicalDependencyList *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__ht_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var1;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var2;
  
  _Var1._M_head_impl =
       (info->query).
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (info->query).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
  _Var2._M_head_impl =
       (this->query).
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (this->query).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (_Var2._M_head_impl != (SelectStatement *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_SQLStatement + 8))();
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->aliases,
              &(info->aliases).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&this->types,
             &(info->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
  ;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->names,
              &(info->names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.temporary =
       (info->super_CreateInfo).temporary;
  ::std::__cxx11::string::_M_assign((string *)&this->sql);
  (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.internal =
       (info->super_CreateInfo).internal;
  __ht = &(info->super_CreateInfo).dependencies;
  this_00 = &(this->super_StandardEntry).dependencies;
  if (__ht != this_00) {
    ::std::
    _Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this_00,
               (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)__ht);
  }
  Value::operator=(&(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment,
                   &(info->super_CreateInfo).comment);
  __ht_00 = &(info->super_CreateInfo).tags;
  this_01 = &(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.tags;
  if (__ht_00 != this_01) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_01,&__ht_00->_M_h);
  }
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::operator=
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&this->column_comments,
             &(info->column_comments).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
  return;
}

Assistant:

void ViewCatalogEntry::Initialize(CreateViewInfo &info) {
	query = std::move(info.query);
	this->aliases = info.aliases;
	this->types = info.types;
	this->names = info.names;
	this->temporary = info.temporary;
	this->sql = info.sql;
	this->internal = info.internal;
	this->dependencies = info.dependencies;
	this->comment = info.comment;
	this->tags = info.tags;
	this->column_comments = info.column_comments;
}